

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O1

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
EncodeConnectivityFromCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex corner_id)

{
  pointer *ppIVar1;
  ulong *puVar2;
  int iVar3;
  mapped_type mVar4;
  iterator iVar5;
  CornerTable *pCVar6;
  _Bit_type *p_Var7;
  iterator iVar8;
  bool bVar9;
  pointer pIVar10;
  mapped_type *pmVar11;
  uint uVar12;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *pMVar13;
  ulong uVar14;
  ulong uVar15;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar16;
  uint neighbor_face_id;
  uint neighbor_face_id_00;
  int iVar17;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_78;
  EdgebreakerTopologyBitPattern local_74;
  int local_70;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_6c;
  vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
  *local_68;
  ulong local_60;
  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *local_58;
  int local_50;
  int local_4c;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_48;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_40;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  pIVar10 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar10) {
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar10;
  }
  local_48 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              *)&this->corner_traversal_stack_;
  iVar5._M_current =
       (this->corner_traversal_stack_).
       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_78.value_ = corner_id.value_;
    std::
    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
    ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
              (local_48,iVar5,&local_78);
  }
  else {
    (iVar5._M_current)->value_ = corner_id.value_;
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  pIVar10 = (this->corner_traversal_stack_).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pIVar10) {
    local_50 = (int)((ulong)((long)(this->mesh_->faces_).vector_.
                                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->mesh_->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)&this->processed_connectivity_corners_;
    local_68 = (vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                *)&(this->traversal_encoder_).symbols_;
    local_40 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->face_to_split_symbol_map_;
    local_58 = this;
    do {
      local_78.value_ = pIVar10[-1].value_;
      if ((local_78.value_ == 0xffffffff) ||
         ((*(ulong *)((long)(this->visited_faces_).super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     + (ulong)(local_78.value_ / 0x18 & 0xfffffff8)) >>
           ((ulong)local_78.value_ / 3 & 0x3f) & 1) != 0)) {
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar10 + -1;
      }
      else {
        pMVar13 = this;
        iVar17 = local_50;
        if (0 < local_50) {
          do {
            pMVar13->last_encoded_symbol_id_ = pMVar13->last_encoded_symbol_id_ + 1;
            local_60 = (ulong)(local_78.value_ / 3);
            if (local_78.value_ == 0xffffffff) {
              local_60 = 0xffffffff;
            }
            puVar2 = (pMVar13->visited_faces_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     (local_60 >> 6);
            *puVar2 = *puVar2 | 1L << ((byte)local_60 & 0x3f);
            iVar5._M_current =
                 (pMVar13->processed_connectivity_corners_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (pMVar13->processed_connectivity_corners_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                        (local_38,iVar5,&local_78);
            }
            else {
              (iVar5._M_current)->value_ = local_78.value_;
              (pMVar13->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
            }
            this = local_58;
            pCVar6 = (pMVar13->corner_table_)._M_t.
                     super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                     .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
            uVar14 = (ulong)local_78.value_;
            uVar15 = 0xffffffff;
            if (uVar14 != 0xffffffff) {
              uVar15 = (ulong)*(uint *)(*(long *)&(pCVar6->corner_to_vertex_map_).vector_ +
                                       uVar14 * 4);
            }
            p_Var7 = (pMVar13->visited_vertex_ids_).super__Bvector_base<std::allocator<bool>_>.
                     _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
            iVar3 = (pMVar13->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar15];
            if (((p_Var7[uVar15 >> 6] >> (uVar15 & 0x3f) & 1) == 0) &&
               (puVar2 = p_Var7 + (uVar15 >> 6), *puVar2 = *puVar2 | 1L << ((byte)uVar15 & 0x3f),
               iVar3 == -1)) {
              local_74 = TOPOLOGY_C;
              iVar8._M_current =
                   (pMVar13->traversal_encoder_).symbols_.
                   super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar8._M_current ==
                  (pMVar13->traversal_encoder_).symbols_.
                  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                          (local_68,iVar8,&local_74);
              }
              else {
                *iVar8._M_current = TOPOLOGY_C;
                (pMVar13->traversal_encoder_).symbols_.
                super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
              IVar16.value_ = local_78.value_;
              if (local_78.value_ != 0xffffffff) {
                IVar16.value_ = local_78.value_ - 2;
                if (0x55555555 < (local_78.value_ + 1) * -0x55555555) {
                  IVar16.value_ = local_78.value_ + 1;
                }
              }
              this = pMVar13;
              local_78.value_ = IVar16.value_;
              if (IVar16.value_ != 0xffffffff) {
                local_78.value_ =
                     *(uint *)(*(long *)&(((pMVar13->corner_table_)._M_t.
                                           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                           .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                          _M_head_impl)->opposite_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              + (ulong)IVar16.value_ * 4);
              }
            }
            else {
              if (local_78.value_ != 0xffffffff) {
                uVar14 = (ulong)(local_78.value_ - 2);
                if (0x55555555 < (local_78.value_ + 1) * -0x55555555) {
                  uVar14 = (ulong)(local_78.value_ + 1);
                }
              }
              uVar12 = (uint)uVar14;
              if (uVar12 != 0xffffffff) {
                uVar12 = *(uint *)(*(long *)&(pCVar6->opposite_corners_).vector_.
                                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  + uVar14 * 4);
              }
              IVar16.value_ = local_78.value_;
              if (local_78.value_ != 0xffffffff) {
                IVar16.value_ =
                     ((local_78.value_ * -0x55555555 < 0x55555556) - 1 | 2) + local_78.value_;
              }
              if (IVar16.value_ != 0xffffffff) {
                IVar16.value_ =
                     *(uint *)(*(long *)&(pCVar6->opposite_corners_).vector_.
                                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                              + (ulong)IVar16.value_ * 4);
              }
              neighbor_face_id_00 = uVar12 / 3;
              if (uVar12 == 0xffffffff) {
                neighbor_face_id_00 = 0xffffffff;
              }
              neighbor_face_id = IVar16.value_ / 3;
              if (IVar16.value_ == 0xffffffff) {
                neighbor_face_id = 0xffffffff;
              }
              local_70 = iVar17;
              local_6c.value_ = uVar12;
              local_4c = iVar3;
              bVar9 = IsRightFaceVisited(local_58,(CornerIndex)local_78.value_);
              if (bVar9) {
                if (uVar12 != 0xffffffff) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,(int)local_60,RIGHT_FACE_EDGE,
                             neighbor_face_id_00);
                }
                bVar9 = IsLeftFaceVisited(this,(CornerIndex)local_78.value_);
                if (bVar9) {
                  if (IVar16.value_ != 0xffffffff) {
                    CheckAndStoreTopologySplitEvent
                              (this,this->last_encoded_symbol_id_,(int)local_60,LEFT_FACE_EDGE,
                               neighbor_face_id);
                  }
                  local_74 = TOPOLOGY_E;
                  iVar8._M_current =
                       (this->traversal_encoder_).symbols_.
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar8._M_current ==
                      (this->traversal_encoder_).symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                    ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                              (local_68,iVar8,&local_74);
                  }
                  else {
                    *iVar8._M_current = TOPOLOGY_E;
                    (this->traversal_encoder_).symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                  }
                  ppIVar1 = &(this->corner_traversal_stack_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + -1;
                  break;
                }
                local_74 = TOPOLOGY_R;
                iVar8._M_current =
                     (this->traversal_encoder_).symbols_.
                     super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (this->traversal_encoder_).symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                  ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                            (local_68,iVar8,&local_74);
                  iVar17 = local_70;
                  local_78.value_ = IVar16.value_;
                }
                else {
                  *iVar8._M_current = TOPOLOGY_R;
                  (this->traversal_encoder_).symbols_.
                  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                  iVar17 = local_70;
                  local_78.value_ = IVar16.value_;
                }
              }
              else {
                bVar9 = IsLeftFaceVisited(this,(CornerIndex)local_78.value_);
                if (!bVar9) {
                  local_74 = TOPOLOGY_S;
                  iVar8._M_current =
                       (this->traversal_encoder_).symbols_.
                       super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar8._M_current ==
                      (this->traversal_encoder_).symbols_.
                      super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                    ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                              (local_68,iVar8,&local_74);
                  }
                  else {
                    *iVar8._M_current = TOPOLOGY_S;
                    (this->traversal_encoder_).symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                  }
                  this->num_split_symbols_ = this->num_split_symbols_ + 1;
                  if (local_4c != -1) {
                    uVar15 = (ulong)(this->vertex_hole_id_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar15];
                    uVar14 = uVar15 + 0x3f;
                    if (-1 < (long)uVar15) {
                      uVar14 = uVar15;
                    }
                    if (((this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar14 >> 6) +
                          (ulong)((uVar15 & 0x800000000000003f) < 0x8000000000000001) +
                          0xffffffffffffffff] >> (uVar15 & 0x3f) & 1) == 0) {
                      EncodeHole(this,(CornerIndex)local_78.value_,false);
                    }
                  }
                  mVar4 = local_58->last_encoded_symbol_id_;
                  local_74 = (EdgebreakerTopologyBitPattern)local_60;
                  pmVar11 = std::__detail::
                            _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[](local_40,(key_type *)&local_74);
                  this = local_58;
                  *pmVar11 = mVar4;
                  iVar5._M_current =
                       (local_58->corner_traversal_stack_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  iVar5._M_current[-1].value_ = IVar16.value_;
                  if (iVar5._M_current ==
                      (local_58->corner_traversal_stack_).
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    ::
                    _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                              (local_48,iVar5,&local_6c);
                  }
                  else {
                    (iVar5._M_current)->value_ = local_6c.value_;
                    (local_58->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                  }
                  break;
                }
                if (IVar16.value_ != 0xffffffff) {
                  CheckAndStoreTopologySplitEvent
                            (this,this->last_encoded_symbol_id_,(int)local_60,LEFT_FACE_EDGE,
                             neighbor_face_id);
                }
                iVar17 = local_70;
                local_74 = TOPOLOGY_L;
                iVar8._M_current =
                     (this->traversal_encoder_).symbols_.
                     super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (this->traversal_encoder_).symbols_.
                    super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::EdgebreakerTopologyBitPattern,std::allocator<draco::EdgebreakerTopologyBitPattern>>
                  ::_M_realloc_insert<draco::EdgebreakerTopologyBitPattern_const&>
                            (local_68,iVar8,&local_74);
                  local_78.value_ = local_6c.value_;
                }
                else {
                  *iVar8._M_current = TOPOLOGY_L;
                  (this->traversal_encoder_).symbols_.
                  super__Vector_base<draco::EdgebreakerTopologyBitPattern,_std::allocator<draco::EdgebreakerTopologyBitPattern>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar8._M_current + 1;
                  local_78.value_ = local_6c.value_;
                }
              }
            }
            iVar17 = iVar17 + -1;
            pMVar13 = this;
          } while (iVar17 != 0);
        }
      }
      pIVar10 = (this->corner_traversal_stack_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != pIVar10);
  }
  return true;
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivityFromCorner(
    CornerIndex corner_id) {
  corner_traversal_stack_.clear();
  corner_traversal_stack_.push_back(corner_id);
  const int num_faces = mesh_->num_faces();
  while (!corner_traversal_stack_.empty()) {
    // Currently processed corner.
    corner_id = corner_traversal_stack_.back();
    // Make sure the face hasn't been visited yet.
    if (corner_id == kInvalidCornerIndex ||
        visited_faces_[corner_table_->Face(corner_id).value()]) {
      // This face has been already traversed.
      corner_traversal_stack_.pop_back();
      continue;
    }
    int num_visited_faces = 0;
    while (num_visited_faces < num_faces) {
      // Mark the current face as visited.
      ++num_visited_faces;
      ++last_encoded_symbol_id_;

      const FaceIndex face_id = corner_table_->Face(corner_id);
      visited_faces_[face_id.value()] = true;
      processed_connectivity_corners_.push_back(corner_id);
      traversal_encoder_.NewCornerReached(corner_id);
      const VertexIndex vert_id = corner_table_->Vertex(corner_id);
      const bool on_boundary = (vertex_hole_id_[vert_id.value()] != -1);
      if (!IsVertexVisited(vert_id)) {
        // A new unvisited vertex has been reached. We need to store its
        // position difference using next, prev, and opposite vertices.
        visited_vertex_ids_[vert_id.value()] = true;
        if (!on_boundary) {
          // If the vertex is on boundary it must correspond to an unvisited
          // hole and it will be encoded with TOPOLOGY_S symbol later).
          traversal_encoder_.EncodeSymbol(TOPOLOGY_C);
          // Move to the right triangle.
          corner_id = GetRightCorner(corner_id);
          continue;
        }
      }
      // The current vertex has been already visited or it was on a boundary.
      // We need to determine whether we can visit any of it's neighboring
      // faces.
      const CornerIndex right_corner_id = GetRightCorner(corner_id);
      const CornerIndex left_corner_id = GetLeftCorner(corner_id);
      const FaceIndex right_face_id = corner_table_->Face(right_corner_id);
      const FaceIndex left_face_id = corner_table_->Face(left_corner_id);
      if (IsRightFaceVisited(corner_id)) {
        // Right face has been already visited.
        // Check whether there is a topology split event.
        if (right_face_id != kInvalidFaceIndex) {
          CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                          face_id.value(), RIGHT_FACE_EDGE,
                                          right_face_id.value());
        }
        if (IsLeftFaceVisited(corner_id)) {
          // Both neighboring faces are visited. End reached.
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_E);
          corner_traversal_stack_.pop_back();
          break;  // Break from the while (num_visited_faces < num_faces) loop.
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_R);
          // Go to the left face.
          corner_id = left_corner_id;
        }
      } else {
        // Right face was not visited.
        if (IsLeftFaceVisited(corner_id)) {
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_L);
          // Left face visited, go to the right one.
          corner_id = right_corner_id;
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_S);
          ++num_split_symbols_;
          // Both neighboring faces are unvisited, we need to visit both of
          // them.
          if (on_boundary) {
            // The tip vertex is on a hole boundary. If the hole hasn't been
            // visited yet we need to encode it.
            const int hole_id = vertex_hole_id_[vert_id.value()];
            if (!visited_holes_[hole_id]) {
              EncodeHole(corner_id, false);
            }
          }
          face_to_split_symbol_map_[face_id.value()] = last_encoded_symbol_id_;
          // Split the traversal.
          // First make the top of the current corner stack point to the left
          // face (this one will be processed second).
          corner_traversal_stack_.back() = left_corner_id;
          // Add a new corner to the top of the stack (right face needs to
          // be traversed first).
          corner_traversal_stack_.push_back(right_corner_id);
          // Break from the while (num_visited_faces < num_faces) loop.
          break;
        }
      }
    }
  }
  return true;  // All corners have been processed.
}